

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O1

int64_t __thiscall
icu_63::RegexMatcher::start64(RegexMatcher *this,int32_t group,UErrorCode *status)

{
  int iVar1;
  UVector32 *pUVar2;
  int64_t iVar3;
  long lVar4;
  int64_t *piVar5;
  
  iVar3 = -1;
  if (U_ZERO_ERROR < *status) {
    return iVar3;
  }
  if (U_ZERO_ERROR < this->fDeferredStatus) {
    *status = this->fDeferredStatus;
    return iVar3;
  }
  if (this->fMatch == '\0') {
    *status = U_REGEX_INVALID_STATE;
    return iVar3;
  }
  if (-1 < group) {
    pUVar2 = this->fPattern->fGroupMap;
    iVar1 = pUVar2->count;
    if (group <= iVar1) {
      if (group == 0) {
        piVar5 = &this->fMatchStart;
      }
      else {
        if (iVar1 < group || iVar1 < 1) {
          lVar4 = 0;
        }
        else {
          lVar4 = (long)pUVar2->elements[(ulong)(uint)group - 1];
        }
        piVar5 = this->fFrame->fExtra + lVar4;
      }
      return *piVar5;
    }
  }
  *status = U_INDEX_OUTOFBOUNDS_ERROR;
  return iVar3;
}

Assistant:

int64_t RegexMatcher::start64(int32_t group, UErrorCode &status) const {
    if (U_FAILURE(status)) {
        return -1;
    }
    if (U_FAILURE(fDeferredStatus)) {
        status = fDeferredStatus;
        return -1;
    }
    if (fMatch == FALSE) {
        status = U_REGEX_INVALID_STATE;
        return -1;
    }
    if (group < 0 || group > fPattern->fGroupMap->size()) {
        status = U_INDEX_OUTOFBOUNDS_ERROR;
        return -1;
    }
    int64_t s;
    if (group == 0) {
        s = fMatchStart;
    } else {
        int32_t groupOffset = fPattern->fGroupMap->elementAti(group-1);
        U_ASSERT(groupOffset < fPattern->fFrameSize);
        U_ASSERT(groupOffset >= 0);
        s = fFrame->fExtra[groupOffset];
    }

    return s;
}